

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

bool chaiscript::bootstrap::Bootstrap::has_parse_tree(Const_Proxy_Function *t_pf)

{
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> pf;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_18;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            (&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return local_18.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0;
}

Assistant:

static bool has_parse_tree(const chaiscript::Const_Proxy_Function &t_pf) noexcept {
      const auto pf = std::dynamic_pointer_cast<const chaiscript::dispatch::Dynamic_Proxy_Function>(t_pf);
      return bool(pf);
    }